

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall Clasp::ClaspFacade::SolveData::~SolveData(SolveData *this)

{
  reset(this);
  BoundArray::~BoundArray(&this->lower);
  BoundArray::~BoundArray(&this->costs);
  SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->algo);
  SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::~SingleOwnerPtr(&this->en);
  return;
}

Assistant:

~SolveData() { reset(); }